

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.c
# Opt level: O0

float calc_average_generic(pooling_calc_context_t calc)

{
  undefined1 auVar1 [28];
  int iVar2;
  int iVar3;
  float fVar4;
  int in_stack_00000008;
  int in_stack_0000000c;
  undefined4 local_24;
  undefined4 local_20;
  int kx;
  int jx_1;
  int ix_1;
  int jx;
  int ix;
  float average_val;
  float val;
  
  auVar1 = (undefined1  [28])calc._0_28_;
  ix = 0;
  calc._0_28_ = auVar1;
  if (calc.wstride == 2) {
    if ((char)calc.offset_x == '\0') {
      iVar2 = calc.hend - calc.hstart;
      calc.hstride = (in_stack_0000000c - in_stack_00000008) * iVar2;
      auVar1 = (undefined1  [28])calc._0_28_;
    }
    calc._0_28_ = auVar1;
    for (ix_1 = in_stack_00000008; auVar1 = (undefined1  [28])calc._0_28_, ix_1 < in_stack_0000000c;
        ix_1 = ix_1 + 1) {
      for (jx_1 = ix_1 * calc.dstart + calc.hstart; jx_1 < ix_1 * calc.dstart + calc.hend;
          jx_1 = jx_1 + 1) {
        fVar4 = (float)(*(code *)calc.x)(calc._32_8_,jx_1 + (int)calc.set_y);
        ix = (int)(fVar4 + (float)ix);
      }
    }
  }
  else if (calc.wstride == 3) {
    if ((char)calc.offset_x == '\0') {
      iVar2 = calc.hend - calc.hstart;
      iVar3 = calc.wend - calc.wstart;
      calc.hstride = (in_stack_0000000c - in_stack_00000008) * iVar2 * iVar3;
      auVar1 = (undefined1  [28])calc._0_28_;
    }
    calc._0_28_ = auVar1;
    for (kx = in_stack_00000008; auVar1 = (undefined1  [28])calc._0_28_, kx < in_stack_0000000c;
        kx = kx + 1) {
      for (local_20 = calc.hstart; local_20 < calc.hend; local_20 = local_20 + 1) {
        for (local_24 = calc.wstart; local_24 < calc.wend; local_24 = local_24 + 1) {
          fVar4 = (float)(*(code *)calc.x)(calc._32_8_,
                                           kx * calc.dstart + local_20 * calc.dend + local_24 +
                                           (int)calc.set_y);
          ix = (int)(fVar4 + (float)ix);
        }
      }
    }
  }
  calc._0_28_ = auVar1;
  return (float)ix / (float)calc.hstride;
}

Assistant:

float calc_average_generic(pooling_calc_context_t calc) {
  float val = 0.0f;
  float average_val = 0.0f;
  if (calc.kernel_size == 2) {
    if (!calc.including_pad) {
      calc.pool_size = (calc.hend - calc.hstart) * (calc.wend - calc.wstart);
    }
    for (int ix = calc.hstart; ix < calc.hend; ix++) {
      for (int jx = ix * calc.hstride + calc.wstart;
           jx < ix * calc.hstride + calc.wend; jx++) {
        val += calc.get_x(calc.x, jx + calc.offset_x);
      }
    }
  } else if (calc.kernel_size == 3) {
    if (!calc.including_pad) {
      calc.pool_size = (calc.hend - calc.hstart) * (calc.wend - calc.wstart) *
                       (calc.dend - calc.dstart);
    }
    for (int ix = calc.hstart; ix < calc.hend; ix++) {
      for (int jx = calc.wstart; jx < calc.wend; jx++) {
        for (int kx = calc.dstart; kx < calc.dend; kx++) {
          val += calc.get_x(calc.x, ix * calc.hstride + jx * calc.wstride + kx +
                                        calc.offset_x);
        }
      }
    }
  }
  average_val = val / calc.pool_size;
  return average_val;
}